

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionSettings.cpp
# Opt level: O0

Dictionary * __thiscall FIX::SessionSettings::get(SessionSettings *this,SessionID *sessionID)

{
  bool bVar1;
  ConfigError *this_00;
  pointer ppVar2;
  allocator<char> local_51;
  string local_50;
  _Self local_30;
  _Base_ptr local_28;
  _Rb_tree_const_iterator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_> local_20;
  const_iterator i;
  SessionID *sessionID_local;
  SessionSettings *this_local;
  
  i._M_node = (_Base_ptr)sessionID;
  std::_Rb_tree_const_iterator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>::
  _Rb_tree_const_iterator(&local_20);
  local_28 = (_Base_ptr)
             std::
             map<FIX::SessionID,_FIX::Dictionary,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
             ::find(&this->m_settings,i._M_node);
  local_20._M_node = local_28;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<FIX::SessionID,_FIX::Dictionary,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
       ::end(&this->m_settings);
  bVar1 = std::operator==(&local_20,&local_30);
  if (!bVar1) {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>::
             operator->(&local_20);
    return &ppVar2->second;
  }
  this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Session not found",&local_51);
  ConfigError::ConfigError(this_00,&local_50);
  __cxa_throw(this_00,&ConfigError::typeinfo,ConfigError::~ConfigError);
}

Assistant:

EXCEPT(ConfigError) {
  Dictionaries::const_iterator i;
  i = m_settings.find(sessionID);
  if (i == m_settings.end()) {
    throw ConfigError("Session not found");
  }
  return i->second;
}